

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteTest.h
# Opt level: O3

void UnitTest::ExecuteTest<(anonymous_namespace)::XmlTestReporterFixtureMultipleFailuresHelper>
               (XmlTestReporterFixtureMultipleFailuresHelper *testObject,TestDetails *details)

{
  XmlTestReporter *this;
  TestResults *results;
  int iVar1;
  TestDetails **ppTVar2;
  TestResults **ppTVar3;
  undefined8 *puVar4;
  char *expected;
  TestDetails failedDetails1;
  TestDetails failedDetails2;
  SignalTranslator sig;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  char *local_4f8;
  TestDetails local_4f0;
  TestDetails local_4d0;
  TestDetails local_4b0;
  SignalTranslator local_490;
  
  ppTVar2 = CurrentTest::Details();
  *ppTVar2 = details;
  SignalTranslator::SignalTranslator(&local_490);
  iVar1 = __sigsetjmp(SignalTranslator::s_jumpTarget,1);
  if (iVar1 == 0) {
    TestDetails::TestDetails(&local_4f0,"FailedTest","suite","fail.h",1);
    TestDetails::TestDetails(&local_4b0,"FailedTest","suite","fail.h",0x1f);
    this = &(testObject->super_XmlTestReporterFixture).reporter;
    DeferredTestReporter::ReportTestStart(&this->super_DeferredTestReporter,&local_4f0);
    DeferredTestReporter::ReportFailure
              (&this->super_DeferredTestReporter,&local_4f0,"expected 1 but was 2");
    DeferredTestReporter::ReportFailure
              (&this->super_DeferredTestReporter,&local_4b0,"expected one but was two");
    DeferredTestReporter::ReportTestFinish(&this->super_DeferredTestReporter,&local_4f0,0.1);
    XmlTestReporter::ReportSummary(this,1,1,2,1.1);
    local_4f8 = 
    "<?xml version=\"1.0\"?><unittest-results tests=\"1\" failedtests=\"1\" failures=\"2\" time=\"1.1\"><test suite=\"suite\" name=\"FailedTest\" time=\"0.1\"><failure message=\"fail.h(1) : expected 1 but was 2\"/><failure message=\"fail.h(31) : expected one but was two\"/></test></unittest-results>"
    ;
    ppTVar3 = CurrentTest::Results();
    results = *ppTVar3;
    std::__cxx11::stringbuf::str();
    ppTVar2 = CurrentTest::Details();
    TestDetails::TestDetails(&local_4d0,*ppTVar2,0xb4);
    CheckEqual<char_const*,std::__cxx11::string>(results,&local_4f8,&local_518,&local_4d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._M_dataplus._M_p != &local_518.field_2) {
      operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
    }
    SignalTranslator::~SignalTranslator(&local_490);
    return;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = "Unhandled system exception";
  __cxa_throw(puVar4,&char_const*::typeinfo,0);
}

Assistant:

void ExecuteTest(T& testObject, TestDetails const& details)
{
	CurrentTest::Details() = &details;

	try
	{
#ifdef UNITTEST_POSIX
		UNITTEST_THROW_SIGNALS
#endif
		testObject.RunImpl();
	}
	catch (AssertException const& e)
	{
		CurrentTest::Results()->OnTestFailure(
			TestDetails(details.testName, details.suiteName, e.Filename(), e.LineNumber()), e.what());
	}
	catch (std::exception const& e)
	{
		MemoryOutStream stream;
		stream << "Unhandled exception: " << e.what();
		CurrentTest::Results()->OnTestFailure(details, stream.GetText());
	}
	catch (...)
	{
		CurrentTest::Results()->OnTestFailure(details, "Unhandled exception: Crash!");
	}
}